

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void generate_exception(DisasContext_conflict12 *ctx,int excp)

{
  TCGContext_conflict11 *tcg_ctx_00;
  TCGv_i32 arg2;
  TCGv_i32 helper_tmp;
  TCGContext_conflict11 *tcg_ctx;
  int excp_local;
  DisasContext_conflict12 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  tcg_gen_movi_i64_riscv64(tcg_ctx_00,tcg_ctx_00->cpu_pc,(ctx->base).pc_next);
  arg2 = tcg_const_i32_riscv64(tcg_ctx_00,excp);
  gen_helper_raise_exception_riscv64(tcg_ctx_00,tcg_ctx_00->cpu_env,arg2);
  tcg_temp_free_i32(tcg_ctx_00,arg2);
  (ctx->base).is_jmp = DISAS_NORETURN;
  return;
}

Assistant:

static inline void generate_exception(DisasContext *ctx, int excp)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    gen_helper_0e0i(raise_exception, excp);
}